

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsValidation.cpp
# Opt level: O1

bool __thiscall
chrono::utils::ChValidation::Process(ChValidation *this,Data *sim_data,Data *ref_data)

{
  Data *this_00;
  Data *this_01;
  ulong uVar1;
  double dVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pvVar5;
  long lVar6;
  pointer pbVar7;
  double *pdVar8;
  ulong uVar9;
  double *pdVar10;
  void *pvVar11;
  ostream *poVar12;
  ulong *puVar13;
  size_t sVar14;
  ulong uVar15;
  size_type __new_size;
  void *pvVar16;
  char *pcVar17;
  ulong uVar18;
  long lVar19;
  size_t sVar20;
  long lVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_XMM3 [16];
  
  if ((this->m_L2_norms)._M_size != 0) {
    operator_delete((this->m_L2_norms)._M_data);
    (this->m_L2_norms)._M_size = 0;
    pdVar10 = (double *)::operator_new(0);
    (this->m_L2_norms)._M_data = pdVar10;
  }
  if ((this->m_RMS_norms)._M_size != 0) {
    operator_delete((this->m_RMS_norms)._M_data);
    (this->m_RMS_norms)._M_size = 0;
    pdVar10 = (double *)::operator_new(0);
    (this->m_RMS_norms)._M_data = pdVar10;
  }
  if ((this->m_INF_norms)._M_size != 0) {
    operator_delete((this->m_INF_norms)._M_data);
    (this->m_INF_norms)._M_size = 0;
    pdVar10 = (double *)::operator_new(0);
    (this->m_INF_norms)._M_data = pdVar10;
  }
  pvVar3 = (sim_data->
           super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (sim_data->
           super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  __new_size = (long)pvVar4 - (long)pvVar3 >> 4;
  this->m_num_cols = __new_size;
  if (pvVar4 == pvVar3) {
    pcVar17 = "ERROR: no values in simulation data structure.";
    lVar19 = 0x2e;
  }
  else {
    sVar20 = pvVar3->_M_size;
    this->m_num_rows = sVar20;
    pvVar5 = (ref_data->
             super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((long)pvVar4 - (long)pvVar3 !=
        (long)(ref_data->
              super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish - (long)pvVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ERROR: the number of columns in the two structures is different:",0x40);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"   Simulation data has ",0x17);
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      pcVar17 = " columns";
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," columns",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"   Reference data has ",0x16);
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      lVar19 = 8;
      goto LAB_0094f262;
    }
    if (sVar20 != pvVar5->_M_size) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ERROR: the number of rows in the two structures is different:",0x3d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"   Simulation data has ",0x17);
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      pcVar17 = " rows";
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," rows",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"   Reference data has ",0x16);
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      lVar19 = 5;
      goto LAB_0094f262;
    }
    this_00 = &this->m_sim_data;
    std::vector<std::valarray<double>,_std::allocator<std::valarray<double>_>_>::resize
              (this_00,__new_size);
    this_01 = &this->m_ref_data;
    std::vector<std::valarray<double>,_std::allocator<std::valarray<double>_>_>::resize
              (this_01,this->m_num_cols);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->m_sim_headers,this->m_num_cols);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->m_ref_headers,this->m_num_cols);
    if (this->m_num_cols != 0) {
      lVar19 = 8;
      lVar21 = 0;
      uVar15 = 0;
      do {
        pvVar3 = (sim_data->
                 super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = (this_00->
                 super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = *(long *)((long)pvVar4 + lVar19 + -8);
        if (lVar6 == *(long *)((long)pvVar3 + lVar19 + -8)) {
          if (lVar6 != 0) {
            pvVar11 = *(void **)((long)&pvVar4->_M_size + lVar19);
            pvVar16 = *(void **)((long)&pvVar3->_M_size + lVar19);
LAB_0094ef65:
            memcpy(pvVar11,pvVar16,lVar6 << 3);
          }
        }
        else {
          pvVar11 = *(void **)((long)&pvVar4->_M_size + lVar19);
          if (pvVar11 != (void *)0x0) {
            operator_delete(pvVar11);
          }
          lVar6 = *(long *)((long)pvVar3 + lVar19 + -8);
          *(long *)((long)pvVar4 + lVar19 + -8) = lVar6;
          pvVar11 = ::operator_new(lVar6 << 3);
          *(void **)((long)&pvVar4->_M_size + lVar19) = pvVar11;
          pvVar16 = *(void **)((long)&pvVar3->_M_size + lVar19);
          if (pvVar16 != (void *)0x0) {
            lVar6 = *(long *)((long)pvVar4 + lVar19 + -8);
            goto LAB_0094ef65;
          }
        }
        pvVar3 = (ref_data->
                 super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = (this_01->
                 super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = *(long *)((long)pvVar4 + lVar19 + -8);
        if (lVar6 == *(long *)((long)pvVar3 + lVar19 + -8)) {
          if (lVar6 != 0) {
            pvVar11 = *(void **)((long)&pvVar4->_M_size + lVar19);
            pvVar16 = *(void **)((long)&pvVar3->_M_size + lVar19);
LAB_0094efd5:
            memcpy(pvVar11,pvVar16,lVar6 << 3);
          }
        }
        else {
          pvVar11 = *(void **)((long)&pvVar4->_M_size + lVar19);
          if (pvVar11 != (void *)0x0) {
            operator_delete(pvVar11);
          }
          lVar6 = *(long *)((long)pvVar3 + lVar19 + -8);
          *(long *)((long)pvVar4 + lVar19 + -8) = lVar6;
          pvVar11 = ::operator_new(lVar6 << 3);
          *(void **)((long)&pvVar4->_M_size + lVar19) = pvVar11;
          pvVar16 = *(void **)((long)&pvVar3->_M_size + lVar19);
          if (pvVar16 != (void *)0x0) {
            lVar6 = *(long *)((long)pvVar4 + lVar19 + -8);
            goto LAB_0094efd5;
          }
        }
        pbVar7 = (this->m_ref_headers).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::_M_replace
                  ((long)&(pbVar7->_M_dataplus)._M_p + lVar21,0,
                   *(char **)((long)pbVar7 + lVar19 * 2 + -8),0xa085fa);
        uVar15 = uVar15 + 1;
        lVar19 = lVar19 + 0x10;
        lVar21 = lVar21 + 0x20;
      } while (uVar15 < this->m_num_cols);
    }
    pvVar3 = (this_00->
             super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pvVar4 = (this_01->
             super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    sVar20 = pvVar3->_M_size;
    pvVar11 = ::operator_new(sVar20 * 8);
    auVar23 = ZEXT816(0) << 0x40;
    if (sVar20 != 0) {
      pdVar10 = pvVar3->_M_data;
      pdVar8 = pvVar4->_M_data;
      sVar14 = 0;
      do {
        *(double *)((long)pvVar11 + sVar14 * 8) = pdVar10[sVar14] - pdVar8[sVar14];
        sVar14 = sVar14 + 1;
      } while (sVar20 != sVar14);
      dVar22 = *(double *)((long)pvVar11 + sVar20 * 8 + -8);
      dVar22 = dVar22 * dVar22;
      for (; auVar23._8_8_ = 0, auVar23._0_8_ = dVar22, sVar20 != 1; sVar20 = sVar20 - 1) {
        dVar2 = *(double *)((long)pvVar11 + sVar20 * 8 + -0x10);
        dVar22 = dVar22 + dVar2 * dVar2;
      }
    }
    if (auVar23._0_8_ < 0.0) {
      dVar22 = sqrt(auVar23._0_8_);
    }
    else {
      auVar23 = vsqrtsd_avx(auVar23,auVar23);
      dVar22 = auVar23._0_8_;
    }
    operator_delete(pvVar11);
    if (dVar22 <= 1e-10) {
      sVar14 = this->m_num_cols;
      sVar20 = sVar14 - 1;
      if ((this->m_L2_norms)._M_size != sVar20) {
        operator_delete((this->m_L2_norms)._M_data);
        (this->m_L2_norms)._M_size = sVar20;
        pdVar10 = (double *)::operator_new(sVar20 * 8);
        (this->m_L2_norms)._M_data = pdVar10;
      }
      if (sVar20 != 0) {
        memset((this->m_L2_norms)._M_data,0,sVar14 * 8 - 8);
      }
      sVar14 = this->m_num_cols;
      sVar20 = sVar14 - 1;
      if ((this->m_RMS_norms)._M_size != sVar20) {
        operator_delete((this->m_RMS_norms)._M_data);
        (this->m_RMS_norms)._M_size = sVar20;
        pdVar10 = (double *)::operator_new(sVar20 * 8);
        (this->m_RMS_norms)._M_data = pdVar10;
      }
      if (sVar20 != 0) {
        memset((this->m_RMS_norms)._M_data,0,sVar14 * 8 - 8);
      }
      sVar14 = this->m_num_cols;
      sVar20 = sVar14 - 1;
      if ((this->m_INF_norms)._M_size != sVar20) {
        operator_delete((this->m_INF_norms)._M_data);
        (this->m_INF_norms)._M_size = sVar20;
        pdVar10 = (double *)::operator_new(sVar20 * 8);
        (this->m_INF_norms)._M_data = pdVar10;
      }
      if (sVar20 != 0) {
        memset((this->m_INF_norms)._M_data,0,sVar14 * 8 - 8);
      }
      if (this->m_num_cols == 1) {
        return true;
      }
      uVar15 = 0;
      do {
        uVar1 = uVar15 + 1;
        pvVar3 = (this_00->
                 super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = (this_01->
                 super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        sVar20 = pvVar3[uVar1]._M_size;
        pvVar11 = ::operator_new(sVar20 * 8);
        auVar24 = ZEXT816(0) << 0x40;
        if (sVar20 != 0) {
          pdVar10 = pvVar3[uVar1]._M_data;
          pdVar8 = pvVar4[uVar1]._M_data;
          sVar14 = 0;
          do {
            *(double *)((long)pvVar11 + sVar14 * 8) = pdVar10[sVar14] - pdVar8[sVar14];
            sVar14 = sVar14 + 1;
          } while (sVar20 != sVar14);
          dVar22 = *(double *)((long)pvVar11 + sVar20 * 8 + -8);
          dVar22 = dVar22 * dVar22;
          for (; auVar24._8_8_ = 0, auVar24._0_8_ = dVar22, sVar20 != 1; sVar20 = sVar20 - 1) {
            dVar2 = *(double *)((long)pvVar11 + sVar20 * 8 + -0x10);
            dVar22 = dVar22 + dVar2 * dVar2;
          }
        }
        if (auVar24._0_8_ < 0.0) {
          dVar22 = sqrt(auVar24._0_8_);
        }
        else {
          auVar23 = vsqrtsd_avx(auVar24,auVar24);
          dVar22 = auVar23._0_8_;
        }
        (this->m_L2_norms)._M_data[uVar15] = dVar22;
        operator_delete(pvVar11);
        pvVar3 = (this->m_sim_data).
                 super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pvVar4 = (this->m_ref_data).
                 super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar20 = pvVar3[uVar1]._M_size;
        pvVar11 = ::operator_new(sVar20 * 8);
        if (sVar20 == 0) {
          auVar25 = SUB6416(ZEXT864(0),0) << 0x40;
        }
        else {
          pdVar10 = pvVar3[uVar1]._M_data;
          pdVar8 = pvVar4[uVar1]._M_data;
          sVar14 = 0;
          do {
            *(double *)((long)pvVar11 + sVar14 * 8) = pdVar10[sVar14] - pdVar8[sVar14];
            sVar14 = sVar14 + 1;
          } while (sVar20 != sVar14);
          dVar22 = *(double *)((long)pvVar11 + sVar20 * 8 + -8);
          dVar22 = dVar22 * dVar22;
          for (sVar14 = sVar20; auVar25._8_8_ = 0, auVar25._0_8_ = dVar22, sVar14 != 1;
              sVar14 = sVar14 - 1) {
            dVar2 = *(double *)((long)pvVar11 + sVar14 * 8 + -0x10);
            dVar22 = dVar22 + dVar2 * dVar2;
          }
        }
        auVar23 = vcvtusi2sd_avx512f(in_XMM3,sVar20);
        auVar26._0_8_ = auVar25._0_8_ / auVar23._0_8_;
        auVar26._8_8_ = auVar25._8_8_;
        if (auVar26._0_8_ < 0.0) {
          dVar22 = sqrt(auVar26._0_8_);
        }
        else {
          auVar23 = vsqrtsd_avx(auVar26,auVar26);
          dVar22 = auVar23._0_8_;
        }
        (this->m_RMS_norms)._M_data[uVar15] = dVar22;
        operator_delete(pvVar11);
        pvVar3 = (this->m_sim_data).
                 super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pvVar4 = (this->m_ref_data).
                 super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar9 = pvVar3[uVar1]._M_size;
        puVar13 = (ulong *)::operator_new(uVar9 * 8);
        if (uVar9 == 0) {
          auVar23 = ZEXT816(0) << 0x40;
        }
        else {
          pdVar10 = pvVar3[uVar1]._M_data;
          pdVar8 = pvVar4[uVar1]._M_data;
          uVar18 = 0;
          auVar29._8_8_ = 0x7fffffffffffffff;
          auVar29._0_8_ = 0x7fffffffffffffff;
          do {
            puVar13[uVar18] = (ulong)(pdVar10[uVar18] - pdVar8[uVar18]);
            uVar18 = uVar18 + 1;
          } while (uVar9 != uVar18);
          auVar27._8_8_ = 0;
          auVar27._0_8_ = *puVar13;
          auVar23 = vandpd_avx(auVar27,auVar29);
        }
        auVar30._8_8_ = 0x7fffffffffffffff;
        auVar30._0_8_ = 0x7fffffffffffffff;
        dVar22 = auVar23._0_8_;
        if (1 < uVar9) {
          uVar18 = 1;
          do {
            auVar28._8_8_ = 0;
            auVar28._0_8_ = puVar13[uVar18];
            auVar24 = vandpd_avx(auVar28,auVar30);
            auVar23 = vmaxsd_avx(auVar24,auVar23);
            dVar22 = auVar23._0_8_;
            uVar18 = uVar18 + 1;
          } while (uVar9 != uVar18);
        }
        (this->m_INF_norms)._M_data[uVar15] = dVar22;
        operator_delete(puVar13);
        uVar15 = uVar1;
      } while (uVar1 < this->m_num_cols - 1);
      return true;
    }
    pcVar17 = "ERROR: time sequences do not match.";
    lVar19 = 0x23;
  }
  poVar12 = (ostream *)&std::cout;
LAB_0094f262:
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar17,lVar19);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  return false;
}

Assistant:

bool ChValidation::Process(const Data& sim_data, const Data& ref_data) {
    // Resize the arrays of norms to zero length
    // (needed if we return with an error below)
    m_L2_norms.resize(0);
    m_RMS_norms.resize(0);
    m_INF_norms.resize(0);

    // Read the simulation results file.
    m_num_cols = sim_data.size();
    if (m_num_cols < 1) {
        std::cout << "ERROR: no values in simulation data structure." << std::endl;
        return false;
    }

    m_num_rows = sim_data[0].size();

    // Perform some sanity checks.
    if (m_num_cols != ref_data.size()) {
        std::cout << "ERROR: the number of columns in the two structures is different:" << std::endl;
        std::cout << "   Simulation data has " << m_num_cols << " columns" << std::endl;
        std::cout << "   Reference data has " << ref_data.size() << " columns" << std::endl;
        return false;
    }

    if (m_num_rows != ref_data[0].size()) {
        std::cout << "ERROR: the number of rows in the two structures is different:" << std::endl;
        std::cout << "   Simulation data has " << m_num_rows << " rows" << std::endl;
        std::cout << "   Reference data has " << ref_data[0].size() << " rows" << std::endl;
        return false;
    }

    // Cache simulation and reference data. Set headers to empty values.
    m_sim_data.resize(m_num_cols);
    m_ref_data.resize(m_num_cols);
    m_sim_headers.resize(m_num_cols);
    m_ref_headers.resize(m_num_cols);
    for (size_t col = 0; col < m_num_cols; col++) {
        m_sim_data[col] = sim_data[col];
        m_ref_data[col] = ref_data[col];
        m_ref_headers[col] = "";
    }

    // Ensure that the first columns (time) are the same.
    if (L2norm(m_sim_data[0] - m_ref_data[0]) > 1e-10) {
        std::cout << "ERROR: time sequences do not match." << std::endl;
        return false;
    }

    // Resize arrays of norms.
    m_L2_norms.resize(m_num_cols - 1);
    m_RMS_norms.resize(m_num_cols - 1);
    m_INF_norms.resize(m_num_cols - 1);

    // Calculate norms of the differences.
    for (size_t col = 0; col < m_num_cols - 1; col++) {
        m_L2_norms[col] = L2norm(m_sim_data[col + 1] - m_ref_data[col + 1]);
        m_RMS_norms[col] = RMSnorm(m_sim_data[col + 1] - m_ref_data[col + 1]);
        m_INF_norms[col] = INFnorm(m_sim_data[col + 1] - m_ref_data[col + 1]);
    }

    return true;
}